

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word Abc_Tt6Isop(word uOn,word uOnDc,int nVars,int *pnCubes)

{
  int iVar1;
  word wVar2;
  word wVar3;
  word uOnDc_00;
  word uOnDc_01;
  word wVar4;
  word wVar5;
  int local_6c;
  int Var;
  word uRes2;
  word uRes1;
  word uRes0;
  word uOnDc1;
  word uOnDc0;
  word uOn1;
  word uOn0;
  int *pnCubes_local;
  int nVars_local;
  word uOnDc_local;
  word uOn_local;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x900,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if ((uOn & (uOnDc ^ 0xffffffffffffffff)) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x901,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if (uOn == 0) {
    uOn_local = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    *pnCubes = *pnCubes + 1;
    uOn_local = 0xffffffffffffffff;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x909,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    local_6c = nVars + -1;
    while (((-1 < local_6c && (iVar1 = Abc_Tt6HasVar(uOn,local_6c), iVar1 == 0)) &&
           (iVar1 = Abc_Tt6HasVar(uOnDc,local_6c), iVar1 == 0))) {
      local_6c = local_6c + -1;
    }
    if (local_6c < 0) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x90e,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    wVar2 = Abc_Tt6Cofactor0(uOn,local_6c);
    wVar3 = Abc_Tt6Cofactor1(uOn,local_6c);
    uOnDc_00 = Abc_Tt6Cofactor0(uOnDc,local_6c);
    uOnDc_01 = Abc_Tt6Cofactor1(uOnDc,local_6c);
    wVar4 = Abc_Tt6Isop(wVar2 & (uOnDc_01 ^ 0xffffffffffffffff),uOnDc_00,local_6c,pnCubes);
    wVar5 = Abc_Tt6Isop(wVar3 & (uOnDc_00 ^ 0xffffffffffffffff),uOnDc_01,local_6c,pnCubes);
    wVar2 = Abc_Tt6Isop(wVar2 & (wVar4 ^ 0xffffffffffffffff) | wVar3 & (wVar5 ^ 0xffffffffffffffff),
                        uOnDc_00 & uOnDc_01,local_6c,pnCubes);
    uOn_local = wVar4 & s_Truths6Neg[local_6c] | wVar5 & s_Truths6[local_6c] | wVar2;
    if ((uOn & (uOn_local ^ 0xffffffffffffffff)) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x91a,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    if ((uOn_local & (uOnDc ^ 0xffffffffffffffff)) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x91b,"word Abc_Tt6Isop(word, word, int, int *)");
    }
  }
  return uOn_local;
}

Assistant:

static inline word Abc_Tt6Isop( word uOn, word uOnDc, int nVars, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int Var;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        (*pnCubes)++;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    uRes0 = Abc_Tt6Isop( uOn0 & ~uOnDc1, uOnDc0, Var, pnCubes );
    uRes1 = Abc_Tt6Isop( uOn1 & ~uOnDc0, uOnDc1, Var, pnCubes );
    uRes2 = Abc_Tt6Isop( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}